

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O0

Map * wasm::FunctionHasher::createMap(Map *__return_storage_ptr__,Module *module)

{
  bool bVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  pointer local_60 [3];
  int local_44;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  Module *module_local;
  Map *hashes;
  
  Map::Map(__return_storage_ptr__);
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(&module->functions);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(&module->functions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&func), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end2);
    local_44 = 0;
    sVar2 = hash<int>(&local_44);
    local_60[0] = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                            (local_40);
    pmVar3 = std::
             map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
             ::operator[](&__return_storage_ptr__->
                           super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                          ,local_60);
    *pmVar3 = sVar2;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

static Map createMap(Module* module) {
    Map hashes;
    for (auto& func : module->functions) {
      // ensure an entry for each function - we must not modify the map shape in
      // parallel, just the values
      hashes[func.get()] = hash(0);
    }
    return hashes;
  }